

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpkdecoder.c
# Opt level: O0

void xpk_decoder_init(XPKDecoder *d)

{
  int local_14;
  int i;
  XPKDecoder *d_local;
  
  d->n_reps = 0;
  d->direct_counter = 0;
  d->next_holder = 0;
  d->cur_x = 0;
  d->cur_y = 0;
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    d->repeat_markers[local_14] = (RepeatMarker *)0x0;
  }
  d->repeat_marker_top = -1;
  return;
}

Assistant:

static void
xpk_decoder_init(XPKDecoder *d)
{
	d->n_reps = 0;
	d->direct_counter = 0;
	d->next_holder = 0;
	d->cur_x = 0;
	d->cur_y = 0;

	for (int i = 0; i < XPK_MAX_REPEAT_MARKERS; i++) {
		d->repeat_markers[i] = NULL;
	}

	d->repeat_marker_top = -1;
}